

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeHandleMovedCursor(VdbeCursor *p)

{
  BtCursor *pCur;
  int iVar1;
  bool bVar2;
  
  pCur = (p->uc).pCursor;
  iVar1 = 0;
  if (2 < pCur->eState) {
    iVar1 = btreeRestoreCursorPosition(pCur);
  }
  bVar2 = false;
  if (iVar1 == 0) {
    bVar2 = pCur->eState == '\0';
    iVar1 = 0;
  }
  p->cacheStatus = 0;
  if (!bVar2) {
    p->nullRow = '\x01';
  }
  return iVar1;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeHandleMovedCursor(VdbeCursor *p){
  int isDifferentRow, rc;
  assert( p->eCurType==CURTYPE_BTREE );
  assert( p->uc.pCursor!=0 );
  assert( sqlite3BtreeCursorHasMoved(p->uc.pCursor) );
  rc = sqlite3BtreeCursorRestore(p->uc.pCursor, &isDifferentRow);
  p->cacheStatus = CACHE_STALE;
  if( isDifferentRow ) p->nullRow = 1;
  return rc;
}